

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void free_line_header(backtrace_state *state,line_header *hdr,
                     backtrace_error_callback error_callback,void *data)

{
  if (hdr->dirs_count != 0) {
    tcmalloc_backtrace_free(state,hdr->dirs,hdr->dirs_count << 3,error_callback,data);
  }
  tcmalloc_backtrace_free(state,hdr->filenames,hdr->filenames_count << 3,error_callback,data);
  return;
}

Assistant:

static void
free_line_header (struct backtrace_state *state, struct line_header *hdr,
		  backtrace_error_callback error_callback, void *data)
{
  if (hdr->dirs_count != 0)
    backtrace_free (state, hdr->dirs, hdr->dirs_count * sizeof (const char *),
		    error_callback, data);
  backtrace_free (state, hdr->filenames,
		  hdr->filenames_count * sizeof (char *),
		  error_callback, data);
}